

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::LocationRecorder
          (LocationRecorder *this,Parser *parser)

{
  Type *this_00;
  
  this->parser_ = parser;
  this_00 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                      (&(parser->source_code_info_->location_).super_RepeatedPtrFieldBase);
  this->location_ = this_00;
  SourceCodeInfo_Location::add_span(this_00,(this->parser_->input_->current_).line);
  SourceCodeInfo_Location::add_span(this->location_,(this->parser_->input_->current_).column);
  return;
}

Assistant:

Parser::LocationRecorder::LocationRecorder(Parser* parser)
  : parser_(parser),
    location_(parser_->source_code_info_->add_location()) {
  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}